

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

DOMNode * __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItem(DOMAttrMapImpl *this,DOMNode *arg)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  DOMDocument *doc;
  DOMNodeImpl *pDVar5;
  DOMDocument *pDVar6;
  DOMException *this_00;
  undefined4 extraout_var_00;
  DOMNodeVector *pDVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  DOMNode *pDVar8;
  ulong index;
  DOMNode *pDVar9;
  undefined8 *puVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  iVar3 = (*arg->_vptr_DOMNode[4])(arg);
  if (iVar3 == 2) {
    iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    doc = (DOMDocument *)CONCAT44(extraout_var,iVar3);
    pDVar5 = castToNodeImpl(arg);
    pDVar6 = DOMNodeImpl::getOwnerDocument(pDVar5);
    if (pDVar6 == doc) {
      bVar1 = readOnly(this);
      if (!bVar1) {
        iVar3 = (*arg->_vptr_DOMNode[4])(arg);
        if (iVar3 == 2) {
          pDVar8 = this->fOwnerNode;
          uVar2 = (ushort)*(uint *)&pDVar5->flags;
          if (((*(uint *)&pDVar5->flags & 8) != 0) && (pDVar5->fOwnerNode != pDVar8)) {
            this_00 = (DOMException *)__cxa_allocate_exception(0x28);
            puVar10 = &XMLPlatformUtils::fgMemoryManager;
            if ((this->fOwnerNode != (DOMNode *)0x0) &&
               (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(),
               CONCAT44(extraout_var_08,iVar3) != 0)) {
              iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
              puVar10 = (undefined8 *)(CONCAT44(extraout_var_09,iVar3) + 0x158);
            }
            DOMException::DOMException(this_00,10,0,(MemoryManager *)*puVar10);
            goto LAB_0026f8e5;
          }
        }
        else {
          pDVar8 = this->fOwnerNode;
          uVar2 = pDVar5->flags;
        }
        pDVar5->fOwnerNode = pDVar8;
        pDVar5->flags = uVar2 | 8;
        iVar3 = (*arg->_vptr_DOMNode[2])(arg);
        uVar4 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                          (this,CONCAT44(extraout_var_00,iVar3));
        if ((int)uVar4 < 0) {
          pDVar7 = this->fNodes;
          if (pDVar7 == (DOMNodeVector *)0x0) {
            pDVar8 = &doc[-1].super_DOMNode;
            if (doc == (DOMDocument *)0x0) {
              pDVar8 = (DOMNode *)0x0;
            }
            iVar3 = (*pDVar8->_vptr_DOMNode[4])(pDVar8,0x18);
            pDVar7 = (DOMNodeVector *)CONCAT44(extraout_var_01,iVar3);
            DOMNodeVector::DOMNodeVector(pDVar7,doc);
            this->fNodes = pDVar7;
          }
          DOMNodeVector::insertElementAt(pDVar7,arg,(ulong)~uVar4);
        }
        else {
          pDVar7 = this->fNodes;
          index = (ulong)uVar4;
          if (index < pDVar7->nextFreeSlot) {
            pDVar8 = pDVar7->data[index];
          }
          else {
            pDVar8 = (DOMNode *)0x0;
          }
          DOMNodeVector::setElementAt(pDVar7,arg,index);
          if (pDVar8 != (DOMNode *)0x0) {
            pDVar9 = &doc->super_DOMNode;
            if (doc == (DOMDocument *)0x0) {
              pDVar9 = (DOMNode *)0x0;
            }
            pDVar5 = castToNodeImpl(pDVar8);
            pDVar5->fOwnerNode = pDVar9;
            pDVar5 = castToNodeImpl(pDVar8);
            pDVar5->flags = pDVar5->flags & 0xfff7;
            return pDVar8;
          }
        }
        return (DOMNode *)0x0;
      }
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      puVar10 = &XMLPlatformUtils::fgMemoryManager;
      if ((this->fOwnerNode != (DOMNode *)0x0) &&
         (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_06,iVar3) != 0))
      {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        puVar10 = (undefined8 *)(CONCAT44(extraout_var_07,iVar3) + 0x158);
      }
      DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar10);
    }
    else {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      puVar10 = &XMLPlatformUtils::fgMemoryManager;
      if ((this->fOwnerNode != (DOMNode *)0x0) &&
         (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_04,iVar3) != 0))
      {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        puVar10 = (undefined8 *)(CONCAT44(extraout_var_05,iVar3) + 0x158);
      }
      DOMException::DOMException(this_00,4,0,(MemoryManager *)*puVar10);
    }
  }
  else {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    puVar10 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_02,iVar3) != 0)) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      puVar10 = (undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 0x158);
    }
    DOMException::DOMException(this_00,3,0,(MemoryManager *)*puVar10);
  }
LAB_0026f8e5:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::setNamedItem(DOMNode *arg)
{
    if (arg->getNodeType() != DOMNode::ATTRIBUTE_NODE)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if(argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if ((arg->getNodeType() == DOMNode::ATTRIBUTE_NODE) && argImpl->isOwned() && (argImpl->fOwnerNode != fOwnerNode))
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i=findNamePoint(arg->getNodeName());
    DOMNode * previous=0;
    if(i>=0)
    {
        previous = fNodes->elementAt(i);
        fNodes->setElementAt(arg,i);
    }
    else
    {
        i=-1-i; // Insert point (may be end of list)
        if(0==fNodes)
        {
            fNodes=new ((DOMDocumentImpl*)doc) DOMNodeVector(doc);
        }
        fNodes->insertElementAt(arg,i);
    }
    if (previous != 0) {
        castToNodeImpl(previous)->fOwnerNode = doc;
        castToNodeImpl(previous)->isOwned(false);
    }

    return previous;
}